

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline_executor.cpp
# Opt level: O2

SourceResultType __thiscall
duckdb::PipelineExecutor::FetchFromSource(PipelineExecutor *this,DataChunk *result)

{
  ThreadContext *this_00;
  SourceResultType SVar1;
  PhysicalOperator *pPVar2;
  type lstate;
  OperatorSourceInput source_input;
  OperatorSourceInput local_48;
  
  pPVar2 = optional_ptr<duckdb::PhysicalOperator,_true>::operator*(&this->pipeline->source);
  StartOperator(this,pPVar2);
  local_48.global_state =
       unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>::
       operator*(&this->pipeline->source_state);
  local_48.local_state =
       unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>,_true>::
       operator*(&this->local_source_state);
  local_48.interrupt_state = &this->interrupt_state;
  pPVar2 = (PhysicalOperator *)result;
  SVar1 = GetData(this,result,&local_48);
  if (SVar1 == FINISHED) {
    this_00 = (this->context).thread;
    pPVar2 = (PhysicalOperator *)
             unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>
             ::operator*(&this->pipeline->source_state);
    lstate = unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>,_true>
             ::operator*(&this->local_source_state);
    OperatorProfiler::FinishSource(&this_00->profiler,(GlobalSourceState *)pPVar2,lstate);
  }
  optional_ptr<duckdb::PhysicalOperator,_true>::operator*(&this->pipeline->source);
  EndOperator(this,pPVar2,(optional_ptr<duckdb::DataChunk,_true>)result);
  return SVar1;
}

Assistant:

SourceResultType PipelineExecutor::FetchFromSource(DataChunk &result) {
	StartOperator(*pipeline.source);

	OperatorSourceInput source_input = {*pipeline.source_state, *local_source_state, interrupt_state};
	auto res = GetData(result, source_input);

	// Ensures sources only return empty results when Blocking or Finished
	D_ASSERT(res != SourceResultType::BLOCKED || result.size() == 0);
	if (res == SourceResultType::FINISHED) {
		// final call into the source - finish source execution
		context.thread.profiler.FinishSource(*pipeline.source_state, *local_source_state);
	}
	EndOperator(*pipeline.source, &result);

	return res;
}